

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O2

int run_test_random_async(void)

{
  int iVar1;
  uv_loop_t *loop;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_random_t req;
  
  loop = uv_default_loop();
  eval_a = -0x16;
  iVar1 = uv_random(loop,&req,scratch,0x100,0xffffffff,random_cb);
  eval_b = (int64_t)iVar1;
  if (eval_b == -0x16) {
    eval_a = -7;
    iVar1 = uv_random(loop,&req,scratch,0xffffffffffffffff,0xffffffff,random_cb);
    eval_b = (int64_t)iVar1;
    if (eval_b == -7) {
      iVar1 = uv_random(loop,&req,scratch,0,0,random_cb);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        eval_a = (int64_t)random_cb_called;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_run(loop,UV_RUN_DEFAULT);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            eval_a = 1;
            eval_b = (int64_t)random_cb_called;
            if (eval_b == 1) {
              iVar1 = uv_random(loop,&req,scratch,0x100,0,random_cb);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                eval_a = 1;
                eval_b = (int64_t)random_cb_called;
                if (eval_b == 1) {
                  iVar1 = uv_run(loop,UV_RUN_DEFAULT);
                  eval_a = (int64_t)iVar1;
                  eval_b = 0;
                  if (eval_a == 0) {
                    eval_a = 2;
                    eval_b = (int64_t)random_cb_called;
                    if (eval_b == 2) {
                      close_loop(loop);
                      eval_a = 0;
                      iVar1 = uv_loop_close(loop);
                      eval_b = (int64_t)iVar1;
                      if (eval_b == 0) {
                        uv_library_shutdown();
                        return 0;
                      }
                      pcVar3 = "uv_loop_close(loop)";
                      pcVar2 = "0";
                      uVar4 = 0x49;
                    }
                    else {
                      pcVar3 = "random_cb_called";
                      pcVar2 = "2";
                      uVar4 = 0x47;
                    }
                  }
                  else {
                    pcVar3 = "0";
                    pcVar2 = "uv_run(loop, UV_RUN_DEFAULT)";
                    uVar4 = 0x46;
                  }
                }
                else {
                  pcVar3 = "random_cb_called";
                  pcVar2 = "1";
                  uVar4 = 0x44;
                }
              }
              else {
                pcVar3 = "0";
                pcVar2 = "uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb)";
                uVar4 = 0x43;
              }
            }
            else {
              pcVar3 = "random_cb_called";
              pcVar2 = "1";
              uVar4 = 0x41;
            }
          }
          else {
            pcVar3 = "0";
            pcVar2 = "uv_run(loop, UV_RUN_DEFAULT)";
            uVar4 = 0x40;
          }
        }
        else {
          pcVar3 = "0";
          pcVar2 = "random_cb_called";
          uVar4 = 0x3e;
        }
      }
      else {
        pcVar3 = "0";
        pcVar2 = "uv_random(loop, &req, scratch, 0, 0, random_cb)";
        uVar4 = 0x3d;
      }
    }
    else {
      pcVar3 = "uv_random(loop, &req, scratch, -1, -1, random_cb)";
      pcVar2 = "UV_E2BIG";
      uVar4 = 0x3b;
    }
  }
  else {
    pcVar3 = "uv_random(loop, &req, scratch, sizeof(scratch), -1, random_cb)";
    pcVar2 = "UV_EINVAL";
    uVar4 = 0x3a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(random_async) {
  uv_random_t req;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT_EQ(UV_EINVAL, uv_random(loop, &req, scratch, sizeof(scratch), -1,
                                 random_cb));
  ASSERT_EQ(UV_E2BIG, uv_random(loop, &req, scratch, -1, -1, random_cb));

  ASSERT_OK(uv_random(loop, &req, scratch, 0, 0, random_cb));
  ASSERT_OK(random_cb_called);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, random_cb_called);

  ASSERT_OK(uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb));
  ASSERT_EQ(1, random_cb_called);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(2, random_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}